

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeFenceHostSynchronize(ze_fence_handle_t hFence,uint64_t timeout)

{
  ze_pfnFenceHostSynchronize_t pfnHostSynchronize;
  ze_result_t result;
  uint64_t timeout_local;
  ze_fence_handle_t hFence_local;
  
  pfnHostSynchronize._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c578 != (code *)0x0) {
    pfnHostSynchronize._4_4_ = (*DAT_0011c578)(hFence,timeout);
  }
  return pfnHostSynchronize._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFenceHostSynchronize(
        ze_fence_handle_t hFence,                       ///< [in] handle of the fence
        uint64_t timeout                                ///< [in] if non-zero, then indicates the maximum time (in nanoseconds) to
                                                        ///< yield before returning ::ZE_RESULT_SUCCESS or ::ZE_RESULT_NOT_READY;
                                                        ///< if zero, then operates exactly like ::zeFenceQueryStatus;
                                                        ///< if `UINT64_MAX`, then function will not return until complete or
                                                        ///< device is lost.
                                                        ///< Due to external dependencies, timeout may be rounded to the closest
                                                        ///< value allowed by the accuracy of those dependencies.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnHostSynchronize = context.zeDdiTable.Fence.pfnHostSynchronize;
        if( nullptr != pfnHostSynchronize )
        {
            result = pfnHostSynchronize( hFence, timeout );
        }
        else
        {
            // generic implementation
        }

        return result;
    }